

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O2

string * __thiscall
google::protobuf::compiler::php::EnumOrMessageSuffix_abi_cxx11_
          (string *__return_storage_ptr__,php *this,FieldDescriptor *field,bool is_descriptor)

{
  CppType CVar1;
  Descriptor *this_00;
  EnumDescriptor *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  string local_38;
  
  CVar1 = FieldDescriptor::cpp_type((FieldDescriptor *)this);
  if (CVar1 == CPPTYPE_MESSAGE) {
    this_00 = FieldDescriptor::message_type((FieldDescriptor *)this);
    MessageFullName_abi_cxx11_
              (&local_38,(php *)this_00,(Descriptor *)((ulong)field & 0xff),is_descriptor);
    std::operator+(&bStack_58,", \'",&local_38);
    std::operator+(__return_storage_ptr__,&bStack_58,"\'");
  }
  else {
    CVar1 = FieldDescriptor::cpp_type((FieldDescriptor *)this);
    if (CVar1 != CPPTYPE_ENUM) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&bStack_58);
      return __return_storage_ptr__;
    }
    this_01 = FieldDescriptor::enum_type((FieldDescriptor *)this);
    EnumFullName_abi_cxx11_
              (&local_38,(php *)this_01,(EnumDescriptor *)((ulong)field & 0xff),is_descriptor);
    std::operator+(&bStack_58,", \'",&local_38);
    std::operator+(__return_storage_ptr__,&bStack_58,"\'");
  }
  std::__cxx11::string::~string((string *)&bStack_58);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string EnumOrMessageSuffix(
    const FieldDescriptor* field, bool is_descriptor) {
  if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
    return ", '" + MessageFullName(field->message_type(), is_descriptor) + "'";
  }
  if (field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM) {
    return ", '" + EnumFullName(field->enum_type(), is_descriptor) + "'";
  }
  return "";
}